

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O1

void __thiscall Omega_h::Read<int>::Read(Read<int> *this,initializer_list<int> l,string *name_in)

{
  int *piVar1;
  void *__buf;
  bool bVar2;
  HostWrite<int> local_30;
  HostWrite<int> local_20;
  
  HostWrite<int>::HostWrite(&local_20,l,name_in);
  HostWrite<int>::write(&local_30,(int)&local_20,__buf,(size_t)name_in);
  (this->write_).shared_alloc_.alloc = local_30.write_.shared_alloc_.alloc;
  bVar2 = ((ulong)local_30.write_.shared_alloc_.alloc & 7) != 0;
  if (bVar2 || local_30.write_.shared_alloc_.alloc == (Alloc *)0x0) {
    (this->write_).shared_alloc_.direct_ptr = local_30.write_.shared_alloc_.direct_ptr;
  }
  else {
    if (entering_parallel == '\x01') {
      (this->write_).shared_alloc_.alloc =
           (Alloc *)((local_30.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_30.write_.shared_alloc_.alloc)->use_count =
           (local_30.write_.shared_alloc_.alloc)->use_count + 1;
    }
    (this->write_).shared_alloc_.direct_ptr = local_30.write_.shared_alloc_.direct_ptr;
    if (!bVar2 && local_30.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_30.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_30.write_.shared_alloc_.alloc);
        operator_delete(local_30.write_.shared_alloc_.alloc,0x48);
      }
    }
  }
  if (((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
      local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_20.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_20.write_.shared_alloc_.alloc);
      operator_delete(local_20.write_.shared_alloc_.alloc,0x48);
    }
  }
  return;
}

Assistant:

Read<T>::Read(std::initializer_list<T> l, std::string const& name_in)
    : Read<T>(HostWrite<T>(l, name_in).write()) {}